

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O2

void __thiscall QDialogButtonBoxPrivate::ensureFirstAcceptIsDefault(QDialogButtonBoxPrivate *this)

{
  QPushButton **ppQVar1;
  bool bVar2;
  QWidget *this_00;
  QWidget *this_01;
  QWidget *pQVar3;
  long lVar4;
  QWidget *pQVar5;
  long lVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<QPushButton_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->buttonLists[0].d.size != 0) {
    pQVar3 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    this_00 = (QWidget *)
              QtPrivate::qobject_cast_helper<QPushButton*,QObject>
                        ((QObject *)*this->buttonLists[0].d.ptr);
    if (this_00 != (QWidget *)0x0) {
      pQVar5 = pQVar3;
      if (pQVar3 == (QWidget *)0x0) {
LAB_0043576e:
        this_01 = (QWidget *)0x0;
      }
      else {
        do {
          if (((pQVar5->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) goto LAB_0043576e;
          pQVar5 = *(QWidget **)(*(long *)&pQVar5->field_0x8 + 0x10);
          this_01 = &QtPrivate::qobject_cast_helper<QDialog*,QObject>(&pQVar5->super_QObject)->
                     super_QWidget;
        } while ((pQVar5 != (QWidget *)0x0) && (this_01 == (QWidget *)0x0));
      }
      pQVar5 = this_01;
      if (this_01 == (QWidget *)0x0) {
        pQVar5 = pQVar3;
      }
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QPushButton **)&DAT_aaaaaaaaaaaaaaaa;
      QObject::findChildren<QPushButton*>
                ((QList<QPushButton_*> *)&local_58,&pQVar5->super_QObject,(FindChildOptions)0x1);
      ppQVar1 = local_58.ptr;
      lVar4 = local_58.size << 3;
      lVar6 = 0;
      do {
        if (lVar4 == lVar6) {
          QPushButton::setDefault((QPushButton *)this_00,true);
          if (((this_01 != (QWidget *)0x0) &&
              (bVar2 = QWidgetPrivate::hasChildWithFocusPolicy
                                 (*(QWidgetPrivate **)&this_01->field_0x8,StrongFocus,pQVar3),
              !bVar2)) && (pQVar3 = QWidget::focusWidget(this_01), pQVar3 == (QWidget *)0x0)) {
            QWidget::setFocus(this_00);
          }
          break;
        }
        pQVar5 = *(QWidget **)((long)ppQVar1 + lVar6);
        bVar2 = QPushButton::isDefault((QPushButton *)pQVar5);
        lVar6 = lVar6 + 8;
      } while (pQVar5 == this_00 || !bVar2);
      QArrayDataPointer<QPushButton_*>::~QArrayDataPointer(&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDialogButtonBoxPrivate::ensureFirstAcceptIsDefault()
{
    Q_Q(QDialogButtonBox);
    const QList<QAbstractButton *> &acceptRoleList = buttonLists[QDialogButtonBox::AcceptRole];
    QPushButton *firstAcceptButton = acceptRoleList.isEmpty()
                                   ? nullptr
                                   : qobject_cast<QPushButton *>(acceptRoleList.at(0));

    if (!firstAcceptButton)
        return;

    bool hasDefault = false;
    QWidget *dialog = nullptr;
    QWidget *p = q;
    while (p && !p->isWindow()) {
        p = p->parentWidget();
        if ((dialog = qobject_cast<QDialog *>(p)))
            break;
    }

    QWidget *parent = dialog ? dialog : q;
    Q_ASSERT(parent);

    const auto pushButtons = parent->findChildren<QPushButton *>();
    for (QPushButton *pushButton : pushButtons) {
        if (pushButton->isDefault() && pushButton != firstAcceptButton) {
            hasDefault = true;
            break;
        }
    }
    if (!hasDefault && firstAcceptButton) {
        firstAcceptButton->setDefault(true);
        // When the QDialogButtonBox is focused, and it doesn't have an
        // explicit focus widget, it will transfer focus to its focus
        // proxy, which is the first button in the layout. This behavior,
        // combined with the behavior that QPushButtons in a QDialog will
        // by default have their autoDefault set to true, results in the
        // focus proxy/first button stealing the default button status
        // immediately when the button box is focused, which is not what
        // we want. Account for this by explicitly making the firstAcceptButton
        // focused as well, unless an explicit focus widget has been set, or
        // a dialog child has Qt::StrongFocus.
        if (dialog && !(QWidgetPrivate::get(dialog)->hasChildWithFocusPolicy(Qt::StrongFocus, q)
                        || dialog->focusWidget()))
            firstAcceptButton->setFocus();
    }
}